

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

size_t __thiscall Fossilize::ScratchAllocator::get_peak_memory_consumption(ScratchAllocator *this)

{
  Impl *pIVar1;
  pointer puVar2;
  Block *block;
  pointer pBVar3;
  
  pIVar1 = this->impl;
  puVar2 = (pointer)0x0;
  for (pBVar3 = (pIVar1->blocks).
                super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pBVar3 != (pIVar1->blocks).
                super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                ._M_impl.super__Vector_impl_data._M_finish; pBVar3 = pBVar3 + 1) {
    puVar2 = (pBVar3->blob).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish +
             ((long)puVar2 -
             (long)(pBVar3->blob).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  }
  if (puVar2 < (pointer)pIVar1->peak_history_size) {
    puVar2 = (pointer)pIVar1->peak_history_size;
  }
  return (size_t)puVar2;
}

Assistant:

size_t ScratchAllocator::get_peak_memory_consumption() const
{
	size_t current_size = 0;
	for (auto &block : impl->blocks)
		current_size += block.blob.size();

	if (impl->peak_history_size > current_size)
		return impl->peak_history_size;
	else
		return current_size;
}